

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

int INT_CMinstall_pull_schedule
              (CManager_conflict cm,timeval *base_time,timeval *period,CMavail_period_ptr avail)

{
  int iVar1;
  __pid_t _Var2;
  void *__dest;
  pthread_t pVar3;
  void *in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  bool bVar4;
  timespec ts_1;
  timespec ts;
  transport_entry_conflict *trans_list;
  timeval end;
  CMavail_period_ptr sorted;
  timeval last_end;
  timeval zero;
  int count;
  int i;
  size_t in_stack_ffffffffffffff40;
  FILE *pFVar5;
  __time_t local_90;
  undefined4 local_88;
  CMTraceType in_stack_ffffffffffffff7c;
  CManager in_stack_ffffffffffffff80;
  long local_78;
  long *local_70;
  long local_68;
  long local_60;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  int local_30;
  uint local_2c;
  void *local_28;
  long *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  
  local_2c = 0;
  local_30 = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_40,0,0x10);
  memset(&local_50,0,0x10);
  do {
    if (*(long *)((long)local_28 + (long)local_30 * 0x20) == local_40) {
      bVar4 = true;
      if (*(long *)((long)local_28 + (long)local_30 * 0x20 + 8) == local_38) {
LAB_00127e65:
        if (*(long *)((long)local_28 + (long)local_30 * 0x20 + 0x10) == local_40) {
          bVar4 = *(long *)((long)local_28 + (long)local_30 * 0x20 + 0x18) != local_38;
        }
        else {
          bVar4 = *(long *)((long)local_28 + (long)local_30 * 0x20 + 0x10) != local_40;
        }
      }
    }
    else {
      bVar4 = true;
      if (*(long *)((long)local_28 + (long)local_30 * 0x20) == local_40) goto LAB_00127e65;
    }
    if (!bVar4) {
      __dest = INT_CMmalloc(in_stack_ffffffffffffff40);
      memcpy(__dest,local_28,(long)local_30 << 5);
      qsort(__dest,(long)local_30,0x20,offset_compare);
      local_2c = 0;
      break;
    }
    if (*(long *)((long)local_28 + (long)local_30 * 0x20) < 0) {
      fprintf(_stderr,"CMinstall_pull_schedule(), avail sec offset is negative.  Rejected\n");
      return 0;
    }
    if (*(long *)((long)local_28 + (long)local_30 * 0x20 + 8) < 0) {
      fprintf(_stderr,"CMinstall_pull_schedule(), avail usec offset is negative.  Rejected\n");
      return 0;
    }
    if (*(long *)((long)local_28 + (long)local_30 * 0x20 + 0x10) < 0) {
      fprintf(_stderr,"CMinstall_pull_schedule(), avail sec duration is negative.  Rejected\n");
      return 0;
    }
    if (*(long *)((long)local_28 + (long)local_30 * 0x20 + 0x18) < 0) {
      fprintf(_stderr,"CMinstall_pull_schedule(), avail usec duration is negative.  Rejected\n");
      return 0;
    }
    local_30 = local_30 + 1;
  } while( true );
LAB_00128094:
  if (local_30 <= (int)local_2c) {
    local_10[0x25] = *local_18;
    local_10[0x26] = local_18[1];
    local_10[0x27] = *local_20;
    local_10[0x28] = local_20[1];
    local_10[0x29] = __dest;
    local_70 = (long *)*local_10;
    iVar1 = CMtrace_val[5];
    if (local_10[0x24] == 0) {
      iVar1 = CMtrace_init(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = (FILE *)local_10[0x24];
        _Var2 = getpid();
        pVar3 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&stack0xffffffffffffff80);
        fprintf((FILE *)local_10[0x24],"%lld.%.9ld - ",in_stack_ffffffffffffff80,local_78);
      }
      fprintf((FILE *)local_10[0x24],"CM installed pull schedule with period %ld secs, %zd usecs\n",
              *local_20,local_20[1]);
    }
    fflush((FILE *)local_10[0x24]);
    while( true ) {
      bVar4 = false;
      if (local_70 != (long *)0x0) {
        bVar4 = *local_70 != 0;
      }
      if (!bVar4) break;
      if (*(long *)(*local_70 + 0xa8) != 0) {
        (**(code **)(*local_70 + 0xa8))
                  (&CMstatic_trans_svcs,*local_70,local_18,local_20,local_10[0x29]);
        iVar1 = CMtrace_val[5];
        if (local_10[0x24] == 0) {
          iVar1 = CMtrace_init(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        }
        if (iVar1 != 0) {
          if (CMtrace_PID != 0) {
            pFVar5 = (FILE *)local_10[0x24];
            _Var2 = getpid();
            pVar3 = pthread_self();
            fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar3);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&local_90);
            fprintf((FILE *)local_10[0x24],"%lld.%.9ld - ",local_90,
                    CONCAT44(in_stack_ffffffffffffff7c,local_88));
          }
          fprintf((FILE *)local_10[0x24],"CM installed pull schedule to transport %s\n",
                  *(undefined8 *)*local_70);
        }
        fflush((FILE *)local_10[0x24]);
      }
      local_70 = local_70 + 1;
    }
    return 0;
  }
  local_68 = *(long *)((long)local_28 + (long)(int)local_2c * 0x20) +
             *(long *)((long)local_28 + (long)(int)local_2c * 0x20 + 0x10);
  local_60 = *(long *)((long)local_28 + (long)(int)local_2c * 0x20 + 8) +
             *(long *)((long)local_28 + (long)(int)local_2c * 0x20 + 0x18);
  if (999999 < local_60) {
    local_68 = local_68 + 1;
    local_60 = local_60 + -1000000;
  }
  if (local_68 == *local_20) {
    if (local_20[1] < local_60) {
LAB_00128183:
      fprintf(_stderr,"CMinstall_pull_schedule(), avail region %d rejected, extends beyond period\n"
              ,(ulong)local_2c);
      free(__dest);
      return -1;
    }
  }
  else if (*local_20 < local_68) goto LAB_00128183;
  if (*(long *)((long)local_28 + (long)(int)local_2c * 0x20) == local_50) {
    if (*(long *)((long)local_28 + (long)(int)local_2c * 0x20 + 8) < local_48) {
LAB_00128225:
      fprintf(_stderr,"CMinstall_pull_schedule(), avail regions overlap. Rejected\n");
      free(__dest);
      return -1;
    }
  }
  else if (*(long *)((long)local_28 + (long)(int)local_2c * 0x20) < local_50) goto LAB_00128225;
  local_50 = local_68;
  local_48 = local_60;
  local_2c = local_2c + 1;
  goto LAB_00128094;
}

Assistant:

extern int
INT_CMinstall_pull_schedule(CManager cm, struct timeval *base_time, 
			    struct timeval *period, CMavail_period_ptr avail)
{
    int i = 0, count = 0;
    struct timeval zero = {0,0}, last_end = {0,0};
    CMavail_period_ptr sorted;
    while (timercmp(&avail[count].offset, &zero, !=) ||
	   timercmp(&avail[count].duration, &zero, !=)) {
	if (avail[count].offset.tv_sec < 0) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail sec offset is negative.  Rejected\n");
	    return 0;
	}
	if (avail[count].offset.tv_usec < 0) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail usec offset is negative.  Rejected\n");
	    return 0;
	}
	if (avail[count].duration.tv_sec < 0) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail sec duration is negative.  Rejected\n");
	    return 0;
	}
	if (avail[count].duration.tv_usec < 0) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail usec duration is negative.  Rejected\n");
	    return 0;
	}
	count++;
    }
    sorted = malloc(sizeof(avail[0]) * (count+1));
    memcpy(sorted, avail, sizeof(avail[0]) * count);
    qsort(sorted, count, sizeof(avail[0]), offset_compare);
    for (i = 0; i < count; i++) {
	struct timeval end;
	timeradd(&avail[i].offset, &avail[i].duration, &end);
	if (timercmp(&end, period, >)) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail region %d rejected, extends beyond period\n", i);
	    free(sorted);
	    return -1;
	}
	if (timercmp(&avail[i].offset, &last_end, <)) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail regions overlap. Rejected\n");
	    free(sorted);
	    return -1;
	}
	last_end = end;
    }

    cm->base_time = *base_time;
    cm->period = *period;
    cm->avail = sorted;
    transport_entry *trans_list;
    trans_list = cm->transports;
    CMtrace_out(cm, CMTransportVerbose, "CM installed pull schedule with period %ld secs, %zd usecs\n", period->tv_sec, (size_t) period->tv_usec);
    while ((trans_list != NULL) && (*trans_list != NULL)) {
	if ((*trans_list)->install_pull_schedule_func) {
	    (*trans_list)->install_pull_schedule_func(&CMstatic_trans_svcs,
						      *trans_list,
						      base_time, period,
						      cm->avail);
	    CMtrace_out(cm, CMTransportVerbose, "CM installed pull schedule to transport %s\n", (*trans_list)->trans_name);
	}
	trans_list++;
    }
    return 0;
}